

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_77::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  AsyncPipe *adapterConstructorParams;
  void *local_50;
  ArrayPtr<const_unsigned_char> local_48;
  AsyncIoStream *local_38;
  AsyncIoStream *s;
  size_t local_28;
  size_t size_local;
  void *buffer_local;
  AsyncPipe *this_local;
  
  adapterConstructorParams = (AsyncPipe *)CONCAT44(in_register_00000034,__fd);
  local_28 = __n;
  size_local = (size_t)__buf;
  buffer_local = adapterConstructorParams;
  this_local = this;
  if (__n == 0) {
    Promise<void>::Promise((Promise<void> *)this);
  }
  else {
    local_38 = kj::_::readMaybe<kj::AsyncIoStream>(&adapterConstructorParams->state);
    if (local_38 == (AsyncIoStream *)0x0) {
      local_48 = arrayPtr<unsigned_char_const>((uchar *)size_local,local_28);
      local_50 = (void *)0x0;
      newAdaptedPromise<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite,kj::(anonymous_namespace)::AsyncPipe&,kj::ArrayPtr<unsigned_char_const>,decltype(nullptr)>
                ((kj *)this,adapterConstructorParams,&local_48,&local_50);
    }
    else {
      (**(local_38->super_AsyncOutputStream)._vptr_AsyncOutputStream)
                (this,&local_38->super_AsyncOutputStream,size_local,local_28);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(const void* buffer, size_t size) override {
    if (size == 0) {
      return READY_NOW;
    } else KJ_IF_MAYBE(s, state) {
      return s->write(buffer, size);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(
          *this, arrayPtr(reinterpret_cast<const byte*>(buffer), size), nullptr);
    }
  }